

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.hh
# Opt level: O3

texcoord3h tinyusdz::operator+(texcoord3h *a,texcoord3h *b)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  half hVar6;
  half hVar7;
  texcoord3h tVar8;
  float fVar9;
  float fVar10;
  uint uVar11;
  float fVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  float local_40;
  
  uVar1 = (a->s).value;
  uVar11 = (uint)uVar1 << 0xd;
  if ((uVar11 & 0xf800000) == 0xf800000) {
    fVar12 = (float)(uVar11 | 0x70000000);
  }
  else if ((uVar11 & 0xf800000) == 0) {
    fVar12 = (float)(uVar11 | 0x38800000) + -6.1035156e-05;
  }
  else {
    fVar12 = (float)((uVar11 & 0xfffe000) + 0x38000000);
  }
  uVar11 = (uint)(b->s).value;
  uVar13 = uVar11 << 0xd;
  if ((uVar13 & 0xf800000) == 0xf800000) {
    local_40 = (float)(uVar13 | 0x70000000);
  }
  else if ((uVar13 & 0xf800000) == 0) {
    local_40 = (float)(uVar13 | 0x38800000) + -6.1035156e-05;
  }
  else {
    local_40 = (float)((uVar13 & 0xfffe000) + 0x38000000);
  }
  uVar2 = (a->t).value;
  uVar3 = (b->t).value;
  uVar13 = (uint)uVar2 << 0xd;
  if ((uVar13 & 0xf800000) == 0xf800000) {
    fVar9 = (float)(uVar13 | 0x70000000);
  }
  else if ((uVar13 & 0xf800000) == 0) {
    fVar9 = (float)(uVar13 | 0x38800000) + -6.1035156e-05;
  }
  else {
    fVar9 = (float)((uVar13 & 0xfffe000) + 0x38000000);
  }
  uVar13 = (uint)uVar3 << 0xd;
  if ((uVar13 & 0xf800000) == 0xf800000) {
    fVar10 = (float)(uVar13 | 0x70000000);
  }
  else if ((uVar13 & 0xf800000) == 0) {
    fVar10 = (float)(uVar13 | 0x38800000) + -6.1035156e-05;
  }
  else {
    fVar10 = (float)((uVar13 & 0xfffe000) + 0x38000000);
  }
  uVar4 = (a->r).value;
  uVar5 = (b->r).value;
  uVar13 = (uint)uVar4 << 0xd;
  if ((uVar13 & 0xf800000) == 0xf800000) {
    fVar15 = (float)(uVar13 | 0x70000000);
  }
  else if ((uVar13 & 0xf800000) == 0) {
    fVar15 = (float)(uVar13 | 0x38800000) + -6.1035156e-05;
  }
  else {
    fVar15 = (float)((uVar13 & 0xfffe000) + 0x38000000);
  }
  uVar13 = (uint)uVar5 << 0xd;
  if ((uVar13 & 0xf800000) == 0xf800000) {
    fVar14 = (float)(uVar13 | 0x70000000);
  }
  else if ((uVar13 & 0xf800000) == 0) {
    fVar14 = (float)(uVar13 | 0x38800000) + -6.1035156e-05;
  }
  else {
    fVar14 = (float)((uVar13 & 0xfffe000) + 0x38000000);
  }
  hVar6 = value::float_to_half_full
                    ((float)((uint)fVar10 | (uVar3 & 0x8000) << 0x10) +
                     (float)((uint)fVar9 | (int)(short)uVar2 & 0x80000000U));
  tVar8.s = value::float_to_half_full
                      ((float)((uint)local_40 | (uVar11 & 0x8000) << 0x10) +
                       (float)((uint)fVar12 | (int)(short)uVar1 & 0x80000000U));
  hVar7 = value::float_to_half_full
                    ((float)((uVar5 & 0x8000) << 0x10 | (uint)fVar14) +
                     (float)((uint)fVar15 | (int)(short)uVar4 & 0x80000000U));
  tVar8.r.value = hVar7.value;
  tVar8.t.value = hVar6.value;
  return tVar8;
}

Assistant:

half operator[](size_t idx) const { return *(&s + idx); }